

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::openPopup(QApplicationPrivate *this,QWidget *popup)

{
  QWindow *pQVar1;
  qsizetype qVar2;
  QWidget *pQVar3;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QWidget *fw;
  QFocusEvent e;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QWidget::windowHandle(in_RSI);
  QGuiApplicationPrivate::activatePopup(pQVar1);
  qVar2 = QGuiApplicationPrivate::popupCount();
  if (qVar2 == 1) {
    grabForPopup((QWidget *)0x2d4627);
  }
  pQVar3 = QWidget::focusWidget((QWidget *)0x2d4631);
  if (pQVar3 == (QWidget *)0x0) {
    qVar2 = QGuiApplicationPrivate::popupCount();
    if ((qVar2 == 1) && (pQVar3 = QApplication::focusWidget(), pQVar3 != (QWidget *)0x0)) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusOut,PopupFocusReason);
      QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_20);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
    }
  }
  else {
    QWidget::focusWidget((QWidget *)0x2d4641);
    QWidget::setFocus((QWidget *)this,popup._4_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::openPopup(QWidget *popup)
{
    QGuiApplicationPrivate::activatePopup(popup->windowHandle());

    if (QGuiApplicationPrivate::popupCount() == 1) // grab mouse/keyboard
        grabForPopup(popup);

    // popups are not focus-handled by the window system (the first
    // popup grabbed the keyboard), so we have to do that manually: A
    // new popup gets the focus
    if (popup->focusWidget()) {
        popup->focusWidget()->setFocus(Qt::PopupFocusReason);
    } else if (QGuiApplicationPrivate::popupCount() == 1) { // this was the first popup
        if (QWidget *fw = QApplication::focusWidget()) {
            QFocusEvent e(QEvent::FocusOut, Qt::PopupFocusReason);
            QCoreApplication::sendEvent(fw, &e);
        }
    }
}